

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFace(Parser *this,Face *out)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  char *szWarn;
  long lStack_40;
  
  bVar2 = SkipSpaces<char>(&this->filePtr);
  if (bVar2) {
    uVar3 = strtoul10(this->filePtr,&this->filePtr);
    out->iFace = uVar3;
    bVar2 = SkipSpaces<char>(&this->filePtr);
    if (bVar2) {
      if (*this->filePtr == ':') {
        this->filePtr = this->filePtr + 1;
      }
      iVar6 = 3;
      while (bVar2 = iVar6 != 0, iVar6 = iVar6 + -1, bVar2) {
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (!bVar2) {
          szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL";
          goto LAB_003dae39;
        }
        uVar3 = (byte)*this->filePtr - 0x41;
        uVar5 = (ulong)uVar3;
        if (0x22 < uVar3) {
LAB_003daef8:
          szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. A,B or C expected [#3]";
          goto LAB_003dae39;
        }
        if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x200000002U >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0x400000004U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_003daef8;
            lStack_40 = 2;
          }
          else {
            lStack_40 = 1;
          }
        }
        else {
          lStack_40 = 0;
        }
        this->filePtr = this->filePtr + 1;
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if ((!bVar2) || (*this->filePtr != ':')) goto LAB_003dae32;
        this->filePtr = this->filePtr + 1;
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (!bVar2) {
          szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. Vertex index ecpected [#4]";
          goto LAB_003dae39;
        }
        uVar3 = strtoul10(this->filePtr,&this->filePtr);
        (out->super_FaceWithSmoothingGroup).mIndices[lStack_40] = uVar3;
      }
      pbVar4 = (byte *)this->filePtr;
      do {
        uVar5 = (ulong)*pbVar4;
        if (uVar5 < 0x2b) {
          if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
            return;
          }
          if (uVar5 == 0x2a) goto LAB_003dae96;
        }
        this->filePtr = (char *)(pbVar4 + 1);
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
LAB_003dae32:
    szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]";
  }
  else {
    szWarn = "Unable to parse *MESH_FACE Element: Unexpected EOL [#1]";
  }
LAB_003dae39:
  LogWarning(this,szWarn);
  SkipToNextToken(this);
  return;
LAB_003dae96:
  bVar2 = TokenMatch<char_const>(&this->filePtr,"*MESH_SMOOTHING",0xf);
  if (bVar2) {
    bVar2 = SkipSpaces<char>(&this->filePtr);
    if (!bVar2) {
      szWarn = 
      "Unable to parse *MESH_SMOOTHING Element: Unexpected EOL. Smoothing group(s) expected [#5]";
      goto LAB_003dae39;
    }
    while( true ) {
      if ((byte)(*this->filePtr - 0x30U) < 9) {
        uVar3 = strtoul10(this->filePtr,&this->filePtr);
        puVar1 = &(out->super_FaceWithSmoothingGroup).iSmoothGroup;
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      }
      SkipSpaces<char>(&this->filePtr);
      pbVar4 = (byte *)this->filePtr;
      if (*pbVar4 != 0x2c) break;
      this->filePtr = (char *)(pbVar4 + 1);
      SkipSpaces<char>(&this->filePtr);
    }
  }
  else {
    pbVar4 = (byte *)this->filePtr;
  }
  do {
    uVar5 = (ulong)*pbVar4;
    if (uVar5 < 0x2b) {
      if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar5 == 0x2a) break;
    }
    this->filePtr = (char *)(pbVar4 + 1);
    pbVar4 = pbVar4 + 1;
  } while( true );
  bVar2 = TokenMatch<char_const>(&this->filePtr,"*MESH_MTLID",0xb);
  if (bVar2) {
    bVar2 = SkipSpaces<char>(&this->filePtr);
    if (!bVar2) {
      szWarn = "Unable to parse *MESH_MTLID Element: Unexpected EOL. Material index expected [#6]";
      goto LAB_003dae39;
    }
    uVar3 = strtoul10(this->filePtr,&this->filePtr);
    out->iMaterial = uVar3;
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFace(ASE::Face& out)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL [#1]");
        SkipToNextToken();
        return;
    }

    // parse the face index
    out.iFace = strtoul10(filePtr,&filePtr);

    // next character should be ':'
    if(!SkipSpaces(&filePtr))
    {
        // FIX: there are some ASE files which haven't got : here ....
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]");
        SkipToNextToken();
        return;
    }
    // FIX: There are some ASE files which haven't got ':' here
    if(':' == *filePtr)++filePtr;

    // Parse all mesh indices
    for (unsigned int i = 0; i < 3;++i)
    {
        unsigned int iIndex = 0;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL");
            SkipToNextToken();
            return;
        }
        switch (*filePtr)
        {
        case 'A':
        case 'a':
            break;
        case 'B':
        case 'b':
            iIndex = 1;
            break;
        case 'C':
        case 'c':
            iIndex = 2;
            break;
        default:
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "A,B or C expected [#3]");
            SkipToNextToken();
            return;
        };
        ++filePtr;

        // next character should be ':'
        if(!SkipSpaces(&filePtr) || ':' != *filePtr)
        {
            LogWarning("Unable to parse *MESH_FACE Element: "
                "Unexpected EOL. \':\' expected [#2]");
            SkipToNextToken();
            return;
        }

        ++filePtr;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "Vertex index ecpected [#4]");
            SkipToNextToken();
            return;
        }
        out.mIndices[iIndex] = strtoul10(filePtr,&filePtr);
    }

    // now we need to skip the AB, BC, CA blocks.
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            //iLineNumber++;
            return;
        }
        filePtr++;
    }

    // parse the smoothing group of the face
    if (TokenMatch(filePtr,"*MESH_SMOOTHING",15))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_SMOOTHING Element: "
                "Unexpected EOL. Smoothing group(s) expected [#5]");
            SkipToNextToken();
            return;
        }

        // Parse smoothing groups until we don't anymore see commas
        // FIX: There needn't always be a value, sad but true
        while (true)
        {
            if (*filePtr < '9' && *filePtr >= '0')
            {
                out.iSmoothGroup |= (1 << strtoul10(filePtr,&filePtr));
            }
            SkipSpaces(&filePtr);
            if (',' != *filePtr)
            {
                break;
            }
            ++filePtr;
            SkipSpaces(&filePtr);
        }
    }

    // *MESH_MTLID  is optional, too
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            return;
        }
        filePtr++;
    }

    if (TokenMatch(filePtr,"*MESH_MTLID",11))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_MTLID Element: Unexpected EOL. "
                "Material index expected [#6]");
            SkipToNextToken();
            return;
        }
        out.iMaterial = strtoul10(filePtr,&filePtr);
    }
    return;
}